

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O3

void __thiscall duckdb::TaskErrorManager::Reset(TaskErrorManager *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    ::std::vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>::_M_erase_at_end
              (&(this->exceptions).
                super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>,
               (this->exceptions).
               super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>.
               super__Vector_base<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>._M_impl.
               super__Vector_impl_data._M_start);
    LOCK();
    (this->has_error)._M_base._M_i = false;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void Reset() {
		lock_guard<mutex> elock(error_lock);
		exceptions.clear();
		has_error = false;
	}